

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderLogCase::init(ShaderLogCase *this,EVP_PKEY_CTX *ctx)

{
  ShaderType SVar1;
  bool bVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined7 extraout_var;
  ContextInfo *pCVar5;
  undefined7 extraout_var_00;
  NotSupportedError *pNVar6;
  allocator<char> local_79;
  string local_78;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  deUint32 local_1c;
  ContextType local_18;
  byte local_11;
  ShaderLogCase *pSStack_10;
  bool supportsES32;
  ShaderLogCase *this_local;
  
  pSStack_10 = this;
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_18.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::es(3,2);
  local_11 = glu::contextSupports(local_18,(ApiType)local_1c);
  SVar1 = this->m_shaderType;
  iVar3 = SVar1 - SHADERTYPE_GEOMETRY;
  if (SHADERTYPE_FRAGMENT < SVar1) {
    if (SVar1 == SHADERTYPE_GEOMETRY) {
      pCVar5 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
      bVar2 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_EXT_geometry_shader");
      iVar3 = (int)CONCAT71(extraout_var,bVar2);
      if ((!bVar2) && ((local_11 & 1) == 0)) {
        local_55 = 1;
        pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,
                   "Test requires GL_EXT_geometry_shader extension or an OpenGL ES 3.2 or higher context."
                   ,&local_41);
        tcu::NotSupportedError::NotSupportedError(pNVar6,&local_40);
        local_55 = 0;
        __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
    }
    else if (SVar1 - SHADERTYPE_TESSELLATION_CONTROL < 2) {
      pCVar5 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
      bVar2 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_EXT_tessellation_shader");
      iVar3 = (int)CONCAT71(extraout_var_00,bVar2);
      if ((!bVar2) && ((local_11 & 1) == 0)) {
        pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,
                   "Test requires GL_EXT_tessellation_shader extension or an OpenGL ES 3.2 or higher context."
                   ,&local_79);
        tcu::NotSupportedError::NotSupportedError(pNVar6,&local_78);
        __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
    }
    else {
      iVar3 = SVar1 - SHADERTYPE_COMPUTE;
    }
  }
  return iVar3;
}

Assistant:

void ShaderLogCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	switch (m_shaderType)
	{
		case glu::SHADERTYPE_VERTEX:
		case glu::SHADERTYPE_FRAGMENT:
		case glu::SHADERTYPE_COMPUTE:
			break;

		case glu::SHADERTYPE_GEOMETRY:
			if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader") && !supportsES32)
				throw tcu::NotSupportedError("Test requires GL_EXT_geometry_shader extension or an OpenGL ES 3.2 or higher context.");
			break;

		case glu::SHADERTYPE_TESSELLATION_CONTROL:
		case glu::SHADERTYPE_TESSELLATION_EVALUATION:
			if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader") && !supportsES32)
				throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension or an OpenGL ES 3.2 or higher context.");
			break;

		default:
			DE_ASSERT(false);
			break;
	}
}